

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  LodePNGDecoderSettings *zlibsettings;
  LodePNGColorMode *color_00;
  LodePNGInfo *info;
  LodePNGColorMode *dest;
  byte bVar1;
  LodePNGColorType LVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  _func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *p_Var6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  size_t sVar11;
  uchar uVar12;
  ushort uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uchar *puVar17;
  uchar *puVar18;
  size_t sVar19;
  uchar *puVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  size_t bytewidth;
  byte *chunk;
  uint uVar32;
  size_t newsize;
  byte *data;
  size_t __size;
  ulong local_2c0;
  LodePNGColorMode *color;
  uchar *local_268;
  size_t sStack_260;
  size_t local_258;
  size_t *local_248;
  uchar **local_240;
  uint passh_1 [7];
  uint passw_1 [7];
  uint passh [7];
  uint passw [7];
  size_t local_1b8 [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  *out = (uchar *)0x0;
  uVar14 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar14;
  if (uVar14 != 0) {
    return uVar14;
  }
  lVar27 = (ulong)*h * (ulong)*w;
  uVar14 = (uint)lVar27;
  if (*h == 0) {
    if (0xfffffff < uVar14) goto LAB_003505e7;
  }
  else if ((int)((ulong)lVar27 >> 0x20) != 0 || 0xfffffff < uVar14) {
LAB_003505e7:
    state->error = 0x5c;
    return 0x5c;
  }
  color_00 = &(state->info_png).color;
  info = &state->info_png;
  zlibsettings = &state->decoder;
  chunk = in + 0x21;
  bVar10 = false;
  uVar28 = 0;
  puVar20 = (uchar *)0x0;
  local_2c0 = 0;
  local_240 = (state->info_png).unknown_chunks_data;
  local_248 = (state->info_png).unknown_chunks_size;
  iVar16 = 1;
  do {
    if (state->error != 0) break;
    uVar14 = 0x1e;
    if ((insize < chunk + (0xc - (long)in)) || (chunk < in)) {
LAB_00350c2e:
      state->error = uVar14;
      break;
    }
    if ((int)((uint)*chunk << 0x18) < 0) {
      uVar14 = 0x3f;
      goto LAB_00350c2e;
    }
    uVar25 = (uint)chunk[3] | (uint)chunk[1] << 0x10 | (uint)chunk[2] << 8 | (uint)*chunk << 0x18;
    uVar22 = (ulong)uVar25;
    if ((insize < chunk + (0xc - (long)in) + uVar22) || (chunk + uVar22 + 0xc < in)) {
      uVar14 = 0x40;
      goto LAB_00350c2e;
    }
    data = chunk + 8;
    uVar12 = lodepng_chunk_type_equals(chunk,"IDAT");
    puVar17 = puVar20;
    if (uVar12 == '\0') {
      uVar12 = lodepng_chunk_type_equals(chunk,"IEND");
      if (uVar12 != '\0') {
        bVar9 = true;
        bVar8 = false;
        goto LAB_003507bf;
      }
      uVar12 = lodepng_chunk_type_equals(chunk,"PLTE");
      if (uVar12 != '\0') {
        puVar18 = (state->info_png).color.palette;
        if (puVar18 != (uchar *)0x0) {
          free(puVar18);
        }
        (state->info_png).color.palettesize = uVar22 / 3;
        puVar18 = (uchar *)malloc(uVar22 / 3 << 2);
        (state->info_png).color.palette = puVar18;
        if ((uVar25 < 3) || (puVar18 != (uchar *)0x0)) {
          if (uVar25 < 0x303) {
            iVar16 = 2;
            if (2 < uVar25) {
              uVar14 = 1;
              iVar16 = 2;
              uVar25 = 2;
              uVar22 = 3;
              do {
                iVar15 = (int)uVar22;
                (state->info_png).color.palette[iVar15 - 3] = data[uVar25 - 2];
                (state->info_png).color.palette[iVar15 - 2] = data[uVar25 - 1];
                uVar23 = (ulong)uVar25;
                uVar25 = uVar25 + 3;
                (state->info_png).color.palette[iVar15 - 1] = data[uVar23];
                (state->info_png).color.palette[uVar22] = 0xff;
                uVar23 = (ulong)uVar14;
                uVar14 = uVar14 + 1;
                uVar22 = (ulong)(iVar15 + 4);
              } while ((state->info_png).color.palettesize != uVar23);
            }
LAB_00350a6f:
            state->error = 0;
            uVar23 = local_2c0;
            goto LAB_003507ba;
          }
LAB_00350c17:
          uVar14 = 0x26;
        }
        else {
          uVar14 = 0x53;
          (state->info_png).color.palettesize = 0;
        }
        goto LAB_00350c2e;
      }
      uVar12 = lodepng_chunk_type_equals(chunk,"tRNS");
      if (uVar12 != '\0') {
        LVar2 = color_00->colortype;
        if (LVar2 == LCT_GREY) {
          if (uVar25 == 2) {
            (state->info_png).color.key_defined = 1;
            lVar27 = 0x1c;
            uVar13 = swap_bytes(*(undefined2 *)(chunk + 8));
            (state->info_png).color.key_b = (uint)uVar13;
            (state->info_png).color.key_g = (uint)uVar13;
LAB_00350a67:
            *(uint *)((long)&color_00->colortype + lVar27) = (uint)uVar13;
            goto LAB_00350a6f;
          }
        }
        else if (LVar2 == LCT_RGB) {
          if (uVar25 == 6) {
            (state->info_png).color.key_defined = 1;
            lVar27 = 0x24;
            uVar13 = swap_bytes(*(undefined2 *)(chunk + 8));
            (state->info_png).color.key_r = (uint)uVar13;
            uVar13 = swap_bytes(*(undefined2 *)(chunk + 10));
            (state->info_png).color.key_g = (uint)uVar13;
            uVar13 = swap_bytes(*(undefined2 *)(chunk + 0xc));
            goto LAB_00350a67;
          }
          uVar14 = 0x29;
        }
        else {
          if (LVar2 == LCT_PALETTE) {
            if ((state->info_png).color.palettesize < uVar22) goto LAB_00350c17;
            if (uVar22 != 0) {
              uVar23 = 0;
              do {
                bVar1 = *data;
                uVar29 = uVar23 & 0xffffffff;
                uVar23 = uVar23 + 4;
                data = data + 1;
                (state->info_png).color.palette[uVar29 + 3] = bVar1;
              } while (uVar22 << 2 != uVar23);
            }
            goto LAB_00350a6f;
          }
          uVar14 = 0x2a;
        }
        goto LAB_00350c2e;
      }
      uVar12 = lodepng_chunk_type_equals(chunk,"bKGD");
      if (uVar12 != '\0') {
        uVar14 = readChunk_bKGD(info,data,uVar22);
        goto LAB_003509d0;
      }
      uVar12 = lodepng_chunk_type_equals(chunk,"tEXt");
      if (uVar12 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar14 = readChunk_tEXt(info,data,uVar22);
LAB_00350b19:
          state->error = uVar14;
          if (uVar14 != 0) break;
        }
LAB_00350b28:
        bVar8 = true;
        bVar9 = false;
        goto LAB_003507bf;
      }
      uVar12 = lodepng_chunk_type_equals(chunk,"zTXt");
      if (uVar12 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar14 = readChunk_zTXt(info,&zlibsettings->zlibsettings,data,uVar22);
          goto LAB_00350b19;
        }
        goto LAB_00350b28;
      }
      uVar12 = lodepng_chunk_type_equals(chunk,"iTXt");
      if (uVar12 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar14 = readChunk_iTXt(info,&zlibsettings->zlibsettings,data,uVar22);
          goto LAB_00350b19;
        }
        goto LAB_00350b28;
      }
      uVar12 = lodepng_chunk_type_equals(chunk,"tIME");
      if (uVar12 != '\0') {
        uVar14 = readChunk_tIME(info,data,uVar22);
LAB_003509d0:
        state->error = uVar14;
        if (uVar14 == 0) goto LAB_00350b28;
        break;
      }
      uVar12 = lodepng_chunk_type_equals(chunk,"pHYs");
      if (uVar12 != '\0') {
        uVar14 = readChunk_pHYs(info,data,uVar22);
        goto LAB_003509d0;
      }
      if ((chunk[4] & 0x20) == 0) {
        uVar14 = 0x45;
        goto LAB_00350c2e;
      }
      bVar10 = true;
      if ((state->decoder).remember_unknown_chunks != 0) {
        uVar14 = lodepng_chunk_append(local_240 + (iVar16 - 1U),local_248 + (iVar16 - 1U),chunk);
        state->error = uVar14;
        if (uVar14 != 0) break;
      }
      bVar9 = false;
LAB_00350812:
      iVar15 = swap_bytes(*(undefined4 *)chunk);
      chunk = chunk + (iVar15 + 0xc);
    }
    else {
      uVar23 = local_2c0 + uVar22;
      if (uVar28 < uVar23) {
        uVar29 = uVar28 * 2;
        uVar28 = uVar23 * 3 >> 1;
        if (uVar29 < uVar23) {
          uVar28 = uVar23;
        }
        puVar17 = (uchar *)realloc(puVar20,uVar28);
        if (puVar17 == (uchar *)0x0) {
          uVar14 = 0x53;
          goto LAB_00350c2e;
        }
      }
      iVar16 = 3;
      if (uVar22 != 0) {
        uVar29 = 0;
        do {
          puVar17[uVar29 + local_2c0] = data[uVar29];
          uVar29 = uVar29 + 1;
        } while (uVar22 != uVar29);
      }
LAB_003507ba:
      local_2c0 = uVar23;
      bVar9 = false;
      bVar8 = true;
      puVar20 = puVar17;
LAB_003507bf:
      if ((state->decoder).ignore_crc == 0 && !bVar10) {
        uVar14 = lodepng_chunk_check_crc(chunk);
        bVar10 = false;
        if (uVar14 != 0) {
          uVar14 = 0x39;
          goto LAB_00350c2e;
        }
      }
      if (bVar8) goto LAB_00350812;
    }
  } while (!bVar9);
  local_258 = 0;
  local_268 = (uchar *)0x0;
  sStack_260 = 0;
  uVar14 = *w;
  if ((state->info_png).interlace_method == 0) {
    uVar25 = *h;
    sVar19 = lodepng_get_raw_size_idat
                       (uVar14,uVar25,(LodePNGColorMode *)(ulong)(state->info_png).color.colortype);
    __size = sVar19 + uVar25;
  }
  else {
    LVar2 = (state->info_png).color.colortype;
    uVar25 = *h;
    uVar32 = uVar25 + 7 >> 3;
    sVar19 = lodepng_get_raw_size_idat(uVar14 + 7 >> 3,uVar32,(LodePNGColorMode *)(ulong)LVar2);
    lVar27 = sVar19 + uVar32;
    if (4 < uVar14) {
      sVar19 = lodepng_get_raw_size_idat(uVar14 + 3 >> 3,uVar32,(LodePNGColorMode *)(ulong)LVar2);
      lVar27 = lVar27 + (ulong)uVar32 + sVar19;
    }
    uVar32 = uVar25 + 3 >> 3;
    sVar19 = lodepng_get_raw_size_idat(uVar14 + 3 >> 2,uVar32,(LodePNGColorMode *)(ulong)LVar2);
    lVar27 = uVar32 + sVar19 + lVar27;
    if (2 < uVar14) {
      uVar32 = uVar25 + 3 >> 2;
      sVar19 = lodepng_get_raw_size_idat(uVar14 + 1 >> 2,uVar32,(LodePNGColorMode *)(ulong)LVar2);
      lVar27 = lVar27 + uVar32 + sVar19;
    }
    uVar32 = uVar25 + 1 >> 2;
    sVar19 = lodepng_get_raw_size_idat(uVar14 + 1 >> 1,uVar32,(LodePNGColorMode *)(ulong)LVar2);
    lVar27 = uVar32 + sVar19 + lVar27;
    if (1 < uVar14) {
      uVar32 = uVar25 + 1 >> 1;
      sVar19 = lodepng_get_raw_size_idat(uVar14 >> 1,uVar32,(LodePNGColorMode *)(ulong)LVar2);
      lVar27 = lVar27 + uVar32 + sVar19;
    }
    sVar19 = lodepng_get_raw_size_idat(uVar14,uVar25 >> 1,(LodePNGColorMode *)(ulong)LVar2);
    __size = sVar19 + (uVar25 >> 1) + lVar27;
  }
  if (state->error == 0) {
    puVar17 = local_268;
    sVar11 = local_258;
    if ((__size == 0) ||
       (puVar17 = (uchar *)malloc(__size), sVar11 = __size, puVar17 != (uchar *)0x0)) {
      local_258 = sVar11;
      local_268 = puVar17;
      p_Var6 = (state->decoder).zlibsettings.custom_zlib;
      if (p_Var6 == (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr
                     *)0x0) {
        uVar14 = lodepng_zlib_decompress
                           (&local_268,&sStack_260,puVar20,local_2c0,&zlibsettings->zlibsettings);
      }
      else {
        uVar14 = (*p_Var6)(&local_268,&sStack_260,puVar20,local_2c0,&zlibsettings->zlibsettings);
      }
      uVar25 = 0x5b;
      if (sStack_260 == __size) {
        uVar25 = uVar14;
      }
      if (uVar14 != 0) {
        uVar25 = uVar14;
      }
    }
    else {
      uVar25 = 0x53;
    }
    state->error = uVar25;
  }
  free(puVar20);
  if (state->error != 0) goto LAB_0035127c;
  uVar25 = *h;
  uVar14 = *w;
  sVar19 = lodepng_get_raw_size(uVar14,uVar25,color_00);
  puVar20 = (uchar *)malloc(sVar19);
  puVar17 = local_268;
  *out = puVar20;
  if (puVar20 == (uchar *)0x0) {
    uVar32 = 0x53;
  }
  else {
    if (sVar19 != 0) {
      sVar21 = 0;
      do {
        (*out)[sVar21] = '\0';
        sVar21 = sVar21 + 1;
      } while (sVar19 != sVar21);
      puVar20 = *out;
      uVar25 = *h;
      uVar14 = *w;
    }
    uVar28 = (ulong)(state->info_png).color.colortype;
    iVar16 = 0;
    if (uVar28 < 7) {
      iVar16 = *(int *)(&DAT_004bfc44 + uVar28 * 4);
    }
    uVar31 = iVar16 * (state->info_png).color.bitdepth;
    if (uVar31 == 0) {
      uVar32 = 0x1f;
    }
    else {
      if ((state->info_png).interlace_method == 0) {
        if (uVar31 < 8) {
          uVar24 = uVar31 * uVar14;
          uVar26 = uVar24 + 7 & 0xfffffff8;
          if (uVar24 != uVar26) {
            uVar32 = unfilter(local_268,local_268,uVar14,uVar25,uVar31);
            if (uVar32 != 0) goto LAB_00351275;
            removePaddingBits(puVar20,puVar17,(ulong)uVar24,(ulong)uVar26,uVar25);
            goto LAB_00351245;
          }
        }
        uVar32 = unfilter(puVar20,local_268,uVar14,uVar25,uVar31);
        if (uVar32 != 0) goto LAB_00351275;
      }
      else {
        Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar14,uVar25,
                            uVar31);
        lVar27 = 0;
        do {
          lVar7 = *(long *)((long)padded_passstart + lVar27 * 2);
          uVar24 = *(uint *)((long)passw + lVar27);
          uVar26 = *(uint *)((long)passh + lVar27);
          uVar32 = unfilter(puVar17 + lVar7,puVar17 + *(long *)((long)filter_passstart + lVar27 * 2)
                            ,uVar24,uVar26,uVar31);
          if (uVar32 != 0) goto LAB_00351275;
          if (uVar31 < 8) {
            uVar24 = uVar24 * uVar31;
            removePaddingBits(puVar17 + *(long *)((long)local_178 + lVar27 * 2),puVar17 + lVar7,
                              (ulong)uVar24,(ulong)(uVar24 + 7 & 0xfffffff8),uVar26);
          }
          lVar27 = lVar27 + 4;
        } while (lVar27 != 0x1c);
        Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_1b8,uVar14,
                            uVar25,uVar31);
        if (uVar31 < 8) {
          lVar27 = 0;
          do {
            uVar25 = passh_1[lVar27];
            if (uVar25 != 0) {
              uVar24 = 0;
              uVar32 = passw_1[lVar27];
              do {
                if ((ulong)uVar32 != 0) {
                  uVar28 = 0;
                  uVar26 = ADAM7_DY[lVar27];
                  sVar19 = local_1b8[lVar27];
                  uVar3 = ADAM7_IY[lVar27];
                  uVar4 = ADAM7_DX[lVar27];
                  uVar5 = ADAM7_IX[lVar27];
                  do {
                    uVar23 = (ulong)((uVar4 * (int)uVar28 +
                                     (uVar26 * uVar24 + uVar3) * uVar14 + uVar5) * uVar31);
                    uVar22 = (ulong)((uVar24 * uVar32 + (int)uVar28) * uVar31) + sVar19 * 8;
                    uVar30 = uVar31;
                    do {
                      if ((puVar17[uVar22 >> 3] >> (~(byte)uVar22 & 7) & 1) != 0) {
                        puVar20[uVar23 >> 3] = puVar20[uVar23 >> 3] | '\x01' << (~(byte)uVar23 & 7);
                      }
                      uVar23 = uVar23 + 1;
                      uVar22 = uVar22 + 1;
                      uVar30 = uVar30 - 1;
                    } while (uVar30 != 0);
                    uVar28 = uVar28 + 1;
                  } while (uVar28 != uVar32);
                }
                uVar24 = uVar24 + 1;
              } while (uVar24 != uVar25);
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != 7);
        }
        else {
          uVar28 = (ulong)(uVar31 >> 3);
          lVar27 = 0;
          do {
            uVar25 = passh_1[lVar27];
            if (uVar25 != 0) {
              uVar22 = 0;
              uVar31 = 0;
              uVar32 = passw_1[lVar27];
              do {
                iVar16 = (int)uVar22;
                if ((ulong)uVar32 != 0) {
                  uVar23 = 0;
                  uVar24 = ADAM7_DX[lVar27];
                  sVar19 = local_1b8[lVar27];
                  uVar26 = (ADAM7_DY[lVar27] * uVar31 + ADAM7_IY[lVar27]) * uVar14 +
                           ADAM7_IX[lVar27];
                  do {
                    uVar29 = 0;
                    do {
                      puVar20[uVar29 + uVar26 * uVar28] = puVar17[uVar29 + uVar22 * uVar28 + sVar19]
                      ;
                      uVar29 = uVar29 + 1;
                    } while (uVar28 != uVar29);
                    uVar23 = uVar23 + 1;
                    uVar26 = uVar26 + uVar24;
                    uVar22 = (ulong)((int)uVar22 + 1);
                  } while (uVar23 != uVar32);
                }
                uVar31 = uVar31 + 1;
                uVar22 = (ulong)(iVar16 + uVar32);
              } while (uVar31 != uVar25);
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != 7);
        }
      }
LAB_00351245:
      uVar32 = 0;
    }
  }
LAB_00351275:
  state->error = uVar32;
LAB_0035127c:
  sStack_260 = 0;
  local_258 = 0;
  free(local_268);
  if (state->error != 0) {
    return state->error;
  }
  dest = &state->info_raw;
  if ((state->decoder).color_convert == 0) {
    uVar14 = lodepng_color_mode_copy(dest,color_00);
    state->error = uVar14;
    return uVar14;
  }
  iVar16 = lodepng_color_mode_equal(dest,color_00);
  if (iVar16 != 0) {
    return 0;
  }
  puVar20 = *out;
  if (((dest->colortype | LCT_GREY_ALPHA) != LCT_RGBA) && ((state->info_raw).bitdepth != 8)) {
    return 0x38;
  }
  uVar14 = *h;
  uVar25 = *w;
  sVar19 = lodepng_get_raw_size(uVar25,uVar14,dest);
  puVar17 = (uchar *)malloc(sVar19);
  *out = puVar17;
  if (puVar17 == (uchar *)0x0) {
    uVar14 = 0x53;
  }
  else {
    uVar14 = lodepng_convert(puVar17,puVar20,dest,color_00,uVar25,uVar14);
  }
  state->error = uVar14;
  free(puVar20);
  return state->error;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize)
{
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color))
  {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert)
    {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  }
  else
  {
    /*color conversion needed; sort of copy of the data*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from greyscale input color type, to 8-bit greyscale or greyscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8))
    {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out))
    {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}